

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapEdit.cc
# Opt level: O0

void mapLoad(string *path,
            vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *obstacles)

{
  byte bVar1;
  bool bVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  istream *piVar5;
  string *in_RDI;
  Point2d pt;
  size_t i;
  size_t size;
  Obstacle *obs;
  stringstream ss;
  string s;
  string error;
  ifstream file;
  value_type *__x;
  istream *in_stack_fffffffffffffb90;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  Point_<double> *in_stack_fffffffffffffba8;
  double local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  ulong uVar6;
  ulong local_420;
  value_type *local_418;
  stringstream local_410 [16];
  ostream local_400 [376];
  string local_288 [32];
  string local_268 [80];
  long local_218 [67];
  
  std::ifstream::ifstream(local_218,in_RDI,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_288);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_218,local_288);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2) break;
      std::__cxx11::stringstream::stringstream(local_410);
      std::operator<<(local_400,local_288);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::emplace_back<>((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        *)in_stack_fffffffffffffb90);
      local_418 = (value_type *)
                  std::
                  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ::back((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                          *)in_stack_fffffffffffffb90);
      local_420 = 0;
      std::istream::operator>>((istream *)local_410,&local_420);
      for (uVar6 = 0; uVar6 < local_420; uVar6 = uVar6 + 1) {
        cv::Point_<double>::Point_((Point_<double> *)&local_438);
        in_stack_fffffffffffffb90 =
             (istream *)std::istream::operator>>((istream *)local_410,&local_438);
        std::istream::operator>>(in_stack_fffffffffffffb90,(double *)&stack0xfffffffffffffbd0);
        __x = local_418;
        cv::Point_::operator_cast_to_Point_(in_stack_fffffffffffffba8);
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                   in_stack_fffffffffffffb90,__x);
      }
      std::__cxx11::stringstream::~stringstream(local_410);
    }
    std::__cxx11::string::~string(local_288);
    std::ifstream::~ifstream(local_218);
    return;
  }
  std::operator+(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98),
                 (char *)in_stack_fffffffffffffb90);
  std::__cxx11::string::~string(local_268);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  uVar4 = std::__cxx11::string::c_str();
  *puVar3 = uVar4;
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

void mapLoad(std::string path, std::vector<std::vector<cv::Point>>& obstacles) {
    std::ifstream file(path, std::ios::in);
    if (!file) {
        std::string error = "map of '" + path + "' does not exist.";
        throw error.c_str();
    }
    std::string s;
    while (getline(file, s)) {
        std::stringstream ss;
        ss << s;
        obstacles.emplace_back();
        Obstacle& obs = obstacles.back();
        size_t size = 0;
        ss >> size;
        for (size_t i = 0; i < size; i++) {
            cv::Point2d pt;
            ss >> pt.x >> pt.y;
            obs.push_back(pt);
        }
    }
}